

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O3

int32_t __thiscall
Assimp::X3DImporter::XML_ReadNode_GetAttrVal_AsI32(X3DImporter *this,int pAttrIdx)

{
  FIReader *pFVar1;
  int iVar2;
  long lVar3;
  undefined4 extraout_var;
  char *pcVar5;
  runtime_error *this_00;
  char cVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  int32_t iVar8;
  long lVar9;
  bool bVar10;
  undefined1 *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  undefined1 local_38 [16];
  char *pcVar4;
  
  pFVar1 = (this->mReader)._M_t.
           super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
           super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
           super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
  (*(pFVar1->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0x12])
            (&local_48,pFVar1,pAttrIdx);
  if (local_48 == (undefined1 *)0x0) {
    p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    lVar9 = 0;
  }
  else {
    lVar3 = __dynamic_cast(local_48,&FIValue::typeinfo,&FIIntValue::typeinfo,0);
    p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    lVar9 = 0;
    if (lVar3 != 0) {
      lVar9 = lVar3;
      if (local_40 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        p_Var7 = local_40;
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_40->_M_use_count = local_40->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_40->_M_use_count = local_40->_M_use_count + 1;
        }
      }
    }
  }
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
  }
  if (lVar9 == 0) {
    iVar2 = (*(((this->mReader)._M_t.
                super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t
                .super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
                super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
              super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])();
    pcVar4 = (char *)CONCAT44(extraout_var,iVar2);
    bVar10 = (*pcVar4 - 0x2bU & 0xfd) == 0;
    cVar6 = pcVar4[bVar10];
    iVar2 = 0;
    if (0xf5 < (byte)(cVar6 - 0x3aU)) {
      pcVar5 = pcVar4 + bVar10;
      iVar2 = 0;
      do {
        pcVar5 = pcVar5 + 1;
        iVar2 = (uint)(byte)(cVar6 - 0x30) + iVar2 * 10;
        cVar6 = *pcVar5;
      } while (0xf5 < (byte)(cVar6 - 0x3aU));
    }
    iVar8 = -iVar2;
    if (*pcVar4 != '-') {
      iVar8 = iVar2;
    }
  }
  else {
    if (*(long *)(lVar9 + 0x10) - (long)*(int32_t **)(lVar9 + 8) != 4) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_48 = local_38;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Invalid int value","");
      std::runtime_error::runtime_error(this_00,(string *)&local_48);
      *(undefined ***)this_00 = &PTR__runtime_error_008dc448;
      __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar8 = **(int32_t **)(lVar9 + 8);
  }
  if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
  }
  return iVar8;
}

Assistant:

int32_t X3DImporter::XML_ReadNode_GetAttrVal_AsI32(const int pAttrIdx)
{
    auto intValue = std::dynamic_pointer_cast<const FIIntValue>(mReader->getAttributeEncodedValue(pAttrIdx));
    if (intValue) {
        if (intValue->value.size() == 1) {
            return intValue->value.front();
        }
        throw DeadlyImportError("Invalid int value");
    }
    else {
        return strtol10(mReader->getAttributeValue(pAttrIdx));
    }
}